

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int __thiscall doctest::String::compare(String *this,char *other,bool no_case)

{
  byte bVar1;
  char *__s1;
  byte in_DL;
  char *in_RSI;
  char *in_RDI;
  undefined7 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  bVar1 = in_DL & 1;
  if (bVar1 == 0) {
    __s1 = c_str((String *)0x10c47b);
    local_4 = strcmp(__s1,in_RSI);
  }
  else {
    c_str((String *)0x10c45f);
    local_4 = anon_unknown_14::stricmp((char *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),in_RDI);
  }
  return local_4;
}

Assistant:

int String::compare(const char* other, bool no_case) const {
    if(no_case)
        return doctest::stricmp(c_str(), other);
    return std::strcmp(c_str(), other);
}